

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O3

spv_result_t
spvtools::val::ValidateBinaryAndKeepValidationState
          (spv_const_context context,spv_const_validator_options options,uint32_t *words,
          size_t num_words,spv_diagnostic *pDiagnostic,
          unique_ptr<spvtools::val::ValidationState_t,_std::default_delete<spvtools::val::ValidationState_t>_>
          *vstate)

{
  _Manager_type p_Var1;
  spv_result_t sVar2;
  ValidationState_t *this;
  spv_context_t local_78;
  
  local_78.target_env = context->target_env;
  local_78._4_4_ = *(undefined4 *)&context->field_0x4;
  local_78.opcode_table = context->opcode_table;
  local_78.operand_table._0_4_ = *(undefined4 *)&context->operand_table;
  local_78.operand_table._4_4_ = *(undefined4 *)((long)&context->operand_table + 4);
  local_78.ext_inst_table._0_4_ = *(undefined4 *)&context->ext_inst_table;
  local_78.ext_inst_table._4_4_ = *(undefined4 *)((long)&context->ext_inst_table + 4);
  local_78.consumer.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_78.consumer.super__Function_base._M_functor._8_8_ = 0;
  local_78.consumer.super__Function_base._M_manager = (_Manager_type)0x0;
  local_78.consumer._M_invoker = (_Invoker_type)0x0;
  p_Var1 = (context->consumer).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&local_78.consumer,(_Any_data *)&context->consumer,__clone_functor);
    local_78.consumer.super__Function_base._M_manager =
         (context->consumer).super__Function_base._M_manager;
    local_78.consumer._M_invoker = (context->consumer)._M_invoker;
  }
  if (pDiagnostic != (spv_diagnostic *)0x0) {
    *pDiagnostic = (spv_diagnostic)0x0;
    UseDiagnosticAsMessageConsumer(&local_78,pDiagnostic);
  }
  this = (ValidationState_t *)operator_new(0x6b8);
  ValidationState_t::ValidationState_t(this,&local_78,options,words,num_words,1);
  std::
  __uniq_ptr_impl<spvtools::val::ValidationState_t,_std::default_delete<spvtools::val::ValidationState_t>_>
  ::reset((__uniq_ptr_impl<spvtools::val::ValidationState_t,_std::default_delete<spvtools::val::ValidationState_t>_>
           *)vstate,this);
  sVar2 = anon_unknown_2::ValidateBinaryUsingContextAndValidationState
                    (&local_78,words,num_words,pDiagnostic,
                     (vstate->_M_t).
                     super___uniq_ptr_impl<spvtools::val::ValidationState_t,_std::default_delete<spvtools::val::ValidationState_t>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::val::ValidationState_t_*,_std::default_delete<spvtools::val::ValidationState_t>_>
                     .super__Head_base<0UL,_spvtools::val::ValidationState_t_*,_false>._M_head_impl)
  ;
  if (local_78.consumer.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_78.consumer.super__Function_base._M_manager)
              ((_Any_data *)&local_78.consumer,(_Any_data *)&local_78.consumer,__destroy_functor);
  }
  return sVar2;
}

Assistant:

spv_result_t ValidateBinaryAndKeepValidationState(
    const spv_const_context context, spv_const_validator_options options,
    const uint32_t* words, const size_t num_words, spv_diagnostic* pDiagnostic,
    std::unique_ptr<ValidationState_t>* vstate) {
  spv_context_t hijack_context = *context;
  if (pDiagnostic) {
    *pDiagnostic = nullptr;
    UseDiagnosticAsMessageConsumer(&hijack_context, pDiagnostic);
  }

  vstate->reset(new ValidationState_t(&hijack_context, options, words,
                                      num_words, kDefaultMaxNumOfWarnings));

  return ValidateBinaryUsingContextAndValidationState(
      hijack_context, words, num_words, pDiagnostic, vstate->get());
}